

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

int __thiscall
QTextDocumentPrivate::remove_block
          (QTextDocumentPrivate *this,int pos,int *blockFormat,int command,Operation op)

{
  QChar QVar1;
  uint uVar2;
  uint uVar3;
  QTextBlockData *pQVar4;
  QTextDocumentPrivate *pQVar5;
  QTextFrame *pQVar6;
  int in_ECX;
  int *in_RDX;
  int in_ESI;
  QTextDocumentPrivate *in_RDI;
  long in_FS_OFFSET;
  int w;
  QTextFrame *frame;
  QTextBlockGroup *group;
  int n;
  uint x;
  int b;
  uint in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  QString *this_00;
  QTextFramePrivate *in_stack_ffffffffffffff70;
  QTextDocumentPrivate *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff88;
  Operation op_00;
  uint in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  uint local_3c;
  int in_stack_ffffffffffffffd8;
  QTextBlock local_18;
  long local_8;
  
  op_00 = (Operation)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = QFragmentMap<QTextBlockData>::findNode
                       ((QFragmentMap<QTextBlockData> *)
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  uVar2 = QFragmentMap<QTextFragmentData>::findNode
                    ((QFragmentMap<QTextFragmentData> *)
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  uVar3 = QFragmentMap<QTextBlockData>::size
                    ((QFragmentMap<QTextBlockData> *)
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  if ((uVar3 != 1) || (in_ECX != 6)) {
    uVar3 = QFragmentMap<QTextBlockData>::next
                      ((QFragmentMap<QTextBlockData> *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff5c);
    op_00 = (Operation)((ulong)&in_RDI->blocks >> 0x20);
    QFragmentMap<QTextBlockData>::size
              ((QFragmentMap<QTextBlockData> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    QFragmentMap<QTextBlockData>::size
              ((QFragmentMap<QTextBlockData> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    QFragmentMap<QTextBlockData>::setSize
              ((QFragmentMap<QTextBlockData> *)in_stack_ffffffffffffff70,
               (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff64);
    pQVar4 = QFragmentMap<QTextBlockData>::fragment
                       ((QFragmentMap<QTextBlockData> *)
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff5c);
    in_stack_ffffffffffffff94 = pQVar4->userState;
    pQVar4 = QFragmentMap<QTextBlockData>::fragment
                       ((QFragmentMap<QTextBlockData> *)
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff5c);
    pQVar4->userState = in_stack_ffffffffffffff94;
    in_stack_ffffffffffffff90 = local_3c;
    local_3c = uVar3;
  }
  uVar3 = (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  pQVar4 = QFragmentMap<QTextBlockData>::fragment
                     ((QFragmentMap<QTextBlockData> *)
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff5c);
  *in_RDX = pQVar4->format;
  QFragmentMap<QTextBlockData>::fragment
            ((QFragmentMap<QTextBlockData> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5c
            );
  objectForFormat(in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  pQVar5 = (QTextDocumentPrivate *)qobject_cast<QTextBlockGroup*>((QObject *)0x7d3408);
  if (pQVar5 != (QTextDocumentPrivate *)0x0) {
    QTextBlock::QTextBlock(&local_18,in_RDI,local_3c);
    (**(code **)(*(long *)pQVar5 + 0x68))(pQVar5,&local_18);
    in_stack_ffffffffffffff78 = pQVar5;
  }
  QFragmentMap<QTextFragmentData>::fragment
            ((QFragmentMap<QTextFragmentData> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5c
            );
  objectForFormat(in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  pQVar6 = qobject_cast<QTextFrame*>((QObject *)0x7d3472);
  if (pQVar6 != (QTextFrame *)0x0) {
    in_stack_ffffffffffffff70 = QTextFrame::d_func((QTextFrame *)0x7d3489);
    this_00 = &in_RDI->text;
    QFragmentMap<QTextFragmentData>::fragment
              ((QFragmentMap<QTextFragmentData> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
    QVar1 = QString::at(this_00,CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    uVar3 = (uint)((ulong)this_00 >> 0x20);
    (**(code **)(*(long *)&in_stack_ffffffffffffff70->super_QTextObjectPrivate + 0x28))
              (in_stack_ffffffffffffff70,QVar1.ucs,uVar2,QVar1.ucs);
    in_RDI->framesDirty = true;
  }
  QFragmentMap<QTextBlockData>::erase_single
            ((QFragmentMap<QTextBlockData> *)in_stack_ffffffffffffff70,uVar3);
  uVar2 = QFragmentMap<QTextFragmentData>::erase_single
                    ((QFragmentMap<QTextFragmentData> *)in_stack_ffffffffffffff70,uVar3);
  adjustDocumentChangesAndCursors
            ((QTextDocumentPrivate *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_ESI,in_stack_ffffffffffffffd8,op_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return uVar2;
}

Assistant:

int QTextDocumentPrivate::remove_block(int pos, int *blockFormat, int command, QTextUndoCommand::Operation op)
{
    Q_ASSERT(pos >= 0);
    Q_ASSERT(blocks.length() == fragments.length());
    Q_ASSERT(blocks.length() > pos);

    int b = blocks.findNode(pos);
    uint x = fragments.findNode(pos);

    Q_ASSERT(x && (int)fragments.position(x) == pos);
    Q_ASSERT(fragments.size(x) == 1);
    Q_ASSERT(isValidBlockSeparator(text.at(fragments.fragment(x)->stringPosition)));
    Q_ASSERT(b);

    if (blocks.size(b) == 1 && command == QTextUndoCommand::BlockAdded) {
        Q_ASSERT((int)blocks.position(b) == pos);
        // qDebug("removing empty block");
        // empty block remove the block itself
    } else {
        // non empty block, merge with next one into this block
        // qDebug("merging block with next");
        int n = blocks.next(b);
        Q_ASSERT((int)blocks.position(n) == pos + 1);
        blocks.setSize(b, blocks.size(b) + blocks.size(n) - 1);
        blocks.fragment(b)->userState = blocks.fragment(n)->userState;
        b = n;
    }
    *blockFormat = blocks.fragment(b)->format;

    QTextBlockGroup *group = qobject_cast<QTextBlockGroup *>(objectForFormat(blocks.fragment(b)->format));
    if (group)
        group->blockRemoved(QTextBlock(this, b));

    QTextFrame *frame = qobject_cast<QTextFrame *>(objectForFormat(fragments.fragment(x)->format));
    if (frame) {
        frame->d_func()->fragmentRemoved(text.at(fragments.fragment(x)->stringPosition), x);
        framesDirty = true;
    }

    blocks.erase_single(b);
    const int w = fragments.erase_single(x);

    adjustDocumentChangesAndCursors(pos, -1, op);

    return w;
}